

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmgen_opna.cpp
# Opt level: O3

void __thiscall FM::OPNBase::DataSave(OPNBase *this,OPNBaseData *data)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  
  Timer::DataSave(&this->super_Timer,&data->timer);
  uVar1 = this->clock;
  uVar2 = this->rate;
  uVar3 = this->psgrate;
  data->fmvolume = this->fmvolume;
  data->clock = uVar1;
  data->rate = uVar2;
  data->psgrate = uVar3;
  data->status = this->status;
  data->prescale = this->prescale;
  Chip::DataSave(&this->chip,&data->chip);
  PSG::DataSave(&this->psg,&data->psg);
  return;
}

Assistant:

void OPNBase::DataSave(struct OPNBaseData* data) {
	Timer::DataSave(&data->timer);
	data->fmvolume = fmvolume;
	data->clock = clock;
	data->rate = rate;
	data->psgrate = psgrate;
	data->status = status;
	data->prescale = prescale;
	chip.DataSave(&data->chip);
	psg.DataSave(&data->psg);
}